

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:573:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:573:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  value *pvVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  object *poVar5;
  long *plVar6;
  long *plVar7;
  uint32_t index;
  uint32_t index_00;
  uint32_t index_01;
  uint32_t index_02;
  uint32_t index_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar8;
  ulong uVar9;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  anon_class_16_1_570cf4e1_for_f *this_00;
  ulong uVar15;
  anon_union_32_5_7b1e0779_for_value_3 *this_01;
  double dVar16;
  double dVar17;
  wstring prop_name;
  wstring to_name;
  object_ptr res;
  wstring local_138;
  double local_118;
  undefined1 local_110 [40];
  undefined1 local_e8 [32];
  ulong local_c8;
  uint local_bc;
  gc_heap *local_b8;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_a8;
  pointer local_a0;
  wstring_view local_98;
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr_untyped *local_78;
  gc_heap_ptr_untyped local_70;
  value *local_60;
  ulong local_58;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_50;
  ulong local_48;
  
  this_00 = &this->f;
  local_60 = __return_storage_ptr__;
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ != object) {
    __assert_fail("type_ == value_type::object",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                  0x46,"const object_ptr &mjs::value::object_value() const");
  }
  uVar10 = (int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  local_78 = (gc_heap_ptr_untyped *)this_00;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_88,(uint32_t)this_00);
  pvVar3 = local_60;
  if (uVar10 == 0) {
    local_60->type_ = object;
    (local_60->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_88.heap_;
    *(uint32_t *)((long)&local_60->field_1 + 8) = local_88.pos_;
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)&(local_60->field_1).s_);
    }
  }
  else {
    this_01 = &this_->field_1;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
    local_138._M_dataplus._M_p = (pointer)0x6;
    local_138._M_string_length = 0x193338;
    (**(code **)*puVar4)(local_110,puVar4);
    uVar2 = to_uint32((value *)local_110);
    local_c8 = CONCAT44(extraout_var,uVar2);
    value::destroy((value *)local_110);
    dVar16 = to_integer((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                        super__Vector_impl_data._M_start);
    local_b8 = (gc_heap *)(double)(local_c8 & 0xffffffff);
    if (0.0 <= dVar16) {
      local_118 = (double)local_b8;
      if (dVar16 <= (double)local_b8) {
        local_118 = dVar16;
      }
    }
    else {
      local_118 = dVar16 + (double)local_b8;
      if (local_118 <= 0.0) {
        local_118 = 0.0;
      }
    }
    uVar8 = extraout_RDX;
    dVar16 = (double)local_b8;
    if (uVar10 != 1) {
      dVar17 = to_integer((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_start + 1);
      uVar8 = extraout_RDX_00;
      dVar16 = 0.0;
      if (0.0 <= dVar17) {
        dVar16 = dVar17;
      }
    }
    uVar15 = (ulong)local_118;
    uVar14 = (uint)uVar15;
    local_48 = uVar15 & 0xffffffff;
    dVar17 = (double)local_b8 - (double)local_48;
    if (dVar16 <= (double)local_b8 - (double)local_48) {
      dVar17 = dVar16;
    }
    local_118 = (double)(long)dVar17;
    local_b8 = (((gc_heap_ptr<mjs::global_object> *)&local_78->heap_)->super_gc_heap_ptr_untyped).
               heap_;
    local_bc = uVar10;
    local_50 = args;
    if (SUB84(local_118,0) != 0) {
      uVar10 = 0;
      do {
        index_string_abi_cxx11_(&local_138,(mjs *)(ulong)(uVar14 + uVar10),(uint32_t)uVar8);
        poVar5 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
        local_110._0_8_ = local_138._M_string_length;
        local_110._8_8_ = local_138._M_dataplus._M_p;
        bVar1 = object::has_property(poVar5,(wstring_view *)local_110);
        uVar8 = extraout_RDX_01;
        if (bVar1) {
          plVar6 = (long *)gc_heap_ptr_untyped::get(&local_88);
          index_string_abi_cxx11_((wstring *)local_e8,(mjs *)(ulong)uVar10,index);
          local_98._M_len = local_e8._8_8_;
          local_98._M_str = (wchar_t *)local_e8._0_8_;
          string::string((string *)&local_70,local_b8,&local_98);
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          local_a8 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                      *)local_138._M_string_length;
          local_a0 = local_138._M_dataplus._M_p;
          (**(code **)*puVar4)((value *)local_110,puVar4,&local_a8);
          (**(code **)(*plVar6 + 8))(plVar6,&local_70,(value *)local_110,0);
          value::destroy((value *)local_110);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
          uVar8 = extraout_RDX_02;
          if ((gc_heap *)local_e8._0_8_ != (gc_heap *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ * 4 + 4);
            uVar8 = extraout_RDX_03;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4
                         );
          uVar8 = extraout_RDX_04;
        }
        uVar10 = uVar10 + 1;
      } while (local_118._0_4_ != uVar10);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get(&local_88);
    plVar7 = (long *)gc_heap_ptr_untyped::get(local_78);
    (**(code **)(*plVar7 + 0x98))(&local_138,plVar7,"length");
    local_110._8_8_ = (undefined8)((ulong)local_118 & 0xffffffff);
    local_110._0_4_ = 3;
    (**(code **)(*plVar6 + 8))(plVar6,&local_138,local_110,0);
    uVar13 = local_bc;
    value::destroy((value *)local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138);
    uVar10 = uVar13 - 2;
    if (uVar13 < 2) {
      uVar10 = 0;
    }
    uVar9 = (ulong)uVar10;
    uVar11 = SUB84(local_118,0);
    uVar13 = (uint)local_c8;
    local_b0 = uVar9;
    if (uVar10 < uVar11) {
      uVar13 = uVar13 - uVar11;
      if (uVar14 < uVar13) {
        do {
          iVar12 = (int)uVar15;
          index_string_abi_cxx11_
                    (&local_138,(mjs *)(ulong)(uint)(SUB84(local_118,0) + iVar12),(uint32_t)uVar9);
          index_string_abi_cxx11_
                    ((wstring *)local_e8,(mjs *)(ulong)(uint)((int)local_b0 + iVar12),index_00);
          poVar5 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          local_110._0_8_ = local_138._M_string_length;
          local_110._8_8_ = local_138._M_dataplus._M_p;
          bVar1 = object::has_property(poVar5,(wstring_view *)local_110);
          if (bVar1) {
            plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
            local_98._M_len = local_e8._8_8_;
            local_98._M_str = (wchar_t *)local_e8._0_8_;
            string::string((string *)&local_70,local_b8,&local_98);
            puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                        *)local_138._M_string_length;
            local_a0 = local_138._M_dataplus._M_p;
            (**(code **)*puVar4)((value *)local_110,puVar4,&local_a8);
            (**(code **)(*plVar6 + 8))(plVar6,&local_70,(value *)local_110,0);
            value::destroy((value *)local_110);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
            uVar9 = extraout_RDX_05;
          }
          else {
            plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
            local_110._0_8_ = local_e8._8_8_;
            local_110._8_8_ = local_e8._0_8_;
            (**(code **)(*plVar6 + 0x10))(plVar6,(value *)local_110);
            uVar9 = extraout_RDX_06;
          }
          if ((gc_heap *)local_e8._0_8_ != (gc_heap *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ * 4 + 4);
            uVar9 = extraout_RDX_07;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            local_138.field_2._M_allocated_capacity * 4 + 4);
            uVar9 = extraout_RDX_08;
          }
          uVar15 = (ulong)(iVar12 + 1U);
        } while (iVar12 + 1U < uVar13);
      }
      uVar13 = uVar13 + (int)local_b0;
      if (uVar13 < (uint)local_c8) {
        uVar15 = local_c8 & 0xffffffff;
        do {
          plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          uVar10 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar10;
          index_string_abi_cxx11_((wstring *)local_110,(mjs *)(ulong)uVar10,index_01);
          local_138._M_dataplus._M_p = (pointer)local_110._8_8_;
          local_138._M_string_length = local_110._0_8_;
          (**(code **)(*plVar6 + 0x10))(plVar6,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_110._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ * 4 + 4);
          }
        } while (uVar13 < uVar10);
      }
    }
    else if ((uVar11 < uVar10) && (uVar11 = uVar13 - uVar11, uVar14 < uVar11)) {
      uVar10 = 2;
      if (local_bc < 2) {
        uVar10 = local_bc;
      }
      local_58 = (ulong)(~uVar10 + local_bc);
      do {
        uVar13 = uVar13 - 1;
        index_string_abi_cxx11_(&local_138,(mjs *)(ulong)uVar13,(uint32_t)uVar9);
        index_string_abi_cxx11_((wstring *)local_e8,(mjs *)(ulong)((int)local_58 + uVar11),index_02)
        ;
        poVar5 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
        local_110._0_8_ = local_138._M_string_length;
        local_110._8_8_ = local_138._M_dataplus._M_p;
        bVar1 = object::has_property(poVar5,(wstring_view *)local_110);
        if (bVar1) {
          plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          local_98._M_len = local_e8._8_8_;
          local_98._M_str = (wchar_t *)local_e8._0_8_;
          string::string((string *)&local_70,local_b8,&local_98);
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          local_a8 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                      *)local_138._M_string_length;
          local_a0 = local_138._M_dataplus._M_p;
          (**(code **)*puVar4)((value *)local_110,puVar4,&local_a8);
          (**(code **)(*plVar6 + 8))(plVar6,&local_70,(value *)local_110,0);
          value::destroy((value *)local_110);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
          uVar9 = extraout_RDX_09;
        }
        else {
          plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
          local_110._0_8_ = local_e8._8_8_;
          local_110._8_8_ = local_e8._0_8_;
          (**(code **)(*plVar6 + 0x10))(plVar6,(value *)local_110);
          uVar9 = extraout_RDX_10;
        }
        if ((gc_heap *)local_e8._0_8_ != (gc_heap *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ * 4 + 4);
          uVar9 = extraout_RDX_11;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4
                         );
          uVar9 = extraout_RDX_12;
        }
        uVar11 = uVar11 - 1;
      } while (uVar14 < uVar11);
    }
    if (2 < local_bc) {
      iVar12 = (int)local_b0;
      uVar15 = 0;
      do {
        plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
        index_string_abi_cxx11_
                  ((wstring *)local_110,(mjs *)(ulong)(uint)((int)local_48 + (int)uVar15),index_03);
        local_e8._0_8_ = local_110._8_8_;
        local_e8._8_8_ = local_110._0_8_;
        string::string((string *)&local_138,local_b8,(wstring_view *)local_e8);
        (**(code **)(*plVar6 + 8))
                  (plVar6,&local_138,
                   (local_50->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start + ((int)uVar15 + 2),0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_110._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)(local_110 + 0x10)) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ * 4 + 4);
        }
        uVar15 = uVar15 + 1;
      } while (iVar12 + (uint)(iVar12 == 0) != uVar15);
    }
    plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_01->s_);
    plVar7 = (long *)gc_heap_ptr_untyped::get(local_78);
    (**(code **)(*plVar7 + 0x98))(&local_138,plVar7,"length");
    local_110._8_8_ = (undefined8)(((int)local_c8 + (int)local_b0) - local_118._0_4_);
    local_110._0_4_ = 3;
    (**(code **)(*plVar6 + 8))(plVar6,&local_138,local_110,0);
    value::destroy((value *)local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138);
    pvVar3 = local_60;
    local_60->type_ = object;
    (local_60->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_88.heap_;
    *(uint32_t *)((long)&local_60->field_1 + 8) = local_88.pos_;
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)&(local_60->field_1).s_);
    }
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  return pvVar3;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }